

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

bool __thiscall
s2textformat::ParsePoints
          (s2textformat *this,string_view str,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  iterator __position;
  pointer pSVar1;
  bool bVar2;
  vector<Vector3<double>,std::allocator<Vector3<double>>> *this_00;
  vector<S2LatLng,_std::allocator<S2LatLng>_> *__range1;
  S2LatLng *latlng;
  pointer this_01;
  string_view str_00;
  vector<S2LatLng,_std::allocator<S2LatLng>_> latlngs;
  vector<S2LatLng,_std::allocator<S2LatLng>_> local_58;
  S2Point local_40;
  
  this_00 = (vector<Vector3<double>,std::allocator<Vector3<double>>> *)str.length_;
  str_00.length_ = str.ptr_;
  local_58.super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>._M_impl.super__Vector_impl_data.
  _M_start = (S2LatLng *)0x0;
  local_58.super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>._M_impl.super__Vector_impl_data.
  _M_finish = (S2LatLng *)0x0;
  local_58.super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  str_00.ptr_ = (char *)this;
  bVar2 = ParseLatLngs(str_00,&local_58);
  pSVar1 = local_58.super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (bVar2) {
    if (local_58.super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_58.super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_01 = local_58.super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        S2LatLng::ToPoint(&local_40,this_01);
        __position._M_current = *(Vector3<double> **)(this_00 + 8);
        if (__position._M_current == *(Vector3<double> **)(this_00 + 0x10)) {
          std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
          _M_realloc_insert<Vector3<double>>(this_00,__position,&local_40);
        }
        else {
          (__position._M_current)->c_[2] = local_40.c_[2];
          (__position._M_current)->c_[0] = local_40.c_[0];
          (__position._M_current)->c_[1] = local_40.c_[1];
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x18;
        }
        this_01 = this_01 + 1;
      } while (this_01 != pSVar1);
    }
  }
  if (local_58.super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>._M_impl.
      super__Vector_impl_data._M_start != (S2LatLng *)0x0) {
    operator_delete(local_58.super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool ParsePoints(string_view str, vector<S2Point>* vertices) {
  vector<S2LatLng> latlngs;
  if (!ParseLatLngs(str, &latlngs)) return false;
  for (const auto& latlng : latlngs) {
    vertices->push_back(latlng.ToPoint());
  }
  return true;
}